

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O0

void duckdb_brotli::BrotliOptimizeHistograms(uint32_t num_distance_codes,MetaBlockSplit *mb)

{
  long in_RSI;
  size_t i;
  uint8_t good_for_rle [704];
  undefined8 local_2e0;
  uint8_t *in_stack_fffffffffffffd90;
  uint32_t *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  
  for (local_2e0 = 0; local_2e0 < *(ulong *)(in_RSI + 0xb8); local_2e0 = local_2e0 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  for (local_2e0 = 0; local_2e0 < *(ulong *)(in_RSI + 200); local_2e0 = local_2e0 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  for (local_2e0 = 0; local_2e0 < *(ulong *)(in_RSI + 0xd8); local_2e0 = local_2e0 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliOptimizeHistograms(uint32_t num_distance_codes,
                              MetaBlockSplit* mb) {
  uint8_t good_for_rle[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t i;
  for (i = 0; i < mb->literal_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(256, mb->literal_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->command_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(BROTLI_NUM_COMMAND_SYMBOLS,
                                      mb->command_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->distance_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(num_distance_codes,
                                      mb->distance_histograms[i].data_,
                                      good_for_rle);
  }
}